

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

TryGetResult __thiscall capnp::SchemaLoader::Impl::tryGet(Impl *this,uint64_t typeId)

{
  ChunkHeader *pCVar1;
  size_t sVar2;
  Maybe<const_capnp::SchemaLoader::LazyLoadCallback_&> extraout_RDX;
  TryGetResult TVar3;
  long local_20;
  
  kj::
  Table<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
  ::find<0ul,unsigned_long&>
            ((Table<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
              *)&local_20,(unsigned_long *)(typeId + 0x68));
  if (local_20 == 0) {
    sVar2 = 0;
  }
  else {
    sVar2 = *(size_t *)(local_20 + 8);
  }
  pCVar1 = *(ChunkHeader **)(typeId + 0x198);
  (this->arena).nextChunkSize = sVar2;
  (this->arena).chunkList = pCVar1;
  TVar3.callback.ptr = extraout_RDX.ptr;
  TVar3.schema = (RawSchema *)this;
  return TVar3;
}

Assistant:

SchemaLoader::Impl::TryGetResult SchemaLoader::Impl::tryGet(uint64_t typeId) const {
  KJ_IF_SOME(schema, schemas.find(typeId)) {
    return {schema, initializer.getCallback()};
  } else {
    return {nullptr, initializer.getCallback()};
  }
}